

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

ExpandMacroResult __thiscall
anon_unknown.dwarf_22cef6::EnvironmentMacroExpander::operator()
          (EnvironmentMacroExpander *this,string *macroNamespace,string *macroName,string *macroOut,
          int param_4)

{
  bool bVar1;
  ExpandMacroResult EVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  
  bVar1 = std::operator==(macroNamespace,"penv");
  if (bVar1) {
    if (macroName->_M_string_length == 0) {
      EVar2 = Error;
    }
    else {
      cmSystemTools::GetEnvVar(&value,macroName);
      if (value.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        std::__cxx11::string::append((string *)macroOut);
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&value);
      EVar2 = Ok;
    }
  }
  else {
    EVar2 = Ignore;
  }
  return EVar2;
}

Assistant:

ExpandMacroResult operator()(const std::string& macroNamespace,
                               const std::string& macroName,
                               std::string& macroOut,
                               int /*version*/) const override
  {
    if (macroNamespace == "penv") {
      if (macroName.empty()) {
        return ExpandMacroResult::Error;
      }
      if (cm::optional<std::string> value =
            cmSystemTools::GetEnvVar(macroName)) {
        macroOut += *value;
      }
      return ExpandMacroResult::Ok;
    }

    return ExpandMacroResult::Ignore;
  }